

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

Node * __thiscall anon_unknown.dwarf_5e4c5e::Db::parseClassEnumType(Db *this)

{
  short *psVar1;
  Node *pNVar2;
  Node *pNVar3;
  _func_int **pp_Var4;
  char *pcVar5;
  
  psVar1 = (short *)this->First;
  pcVar5 = this->Last;
  if (((ulong)((long)pcVar5 - (long)psVar1) < 2) || (*psVar1 != 0x7354)) {
    psVar1 = (short *)this->First;
    if (((ulong)((long)pcVar5 - (long)psVar1) < 2) || (*psVar1 != 0x7554)) {
      psVar1 = (short *)this->First;
      if (((ulong)((long)pcVar5 - (long)psVar1) < 2) || (*psVar1 != 0x6554)) {
        pp_Var4 = (_func_int **)0x0;
        pcVar5 = (char *)0x0;
        goto LAB_001e134c;
      }
      pcVar5 = "enum";
      pp_Var4 = (_func_int **)0x1eaac1;
    }
    else {
      pcVar5 = "union";
      pp_Var4 = (_func_int **)0x205b44;
    }
  }
  else {
    pcVar5 = "struct";
    pp_Var4 = (_func_int **)0x1e5190;
  }
  this->First = (char *)(psVar1 + 1);
LAB_001e134c:
  pNVar2 = parseName(this,(NameState *)0x0);
  pNVar3 = (Node *)0x0;
  if ((pNVar2 != (Node *)0x0) && (pNVar3 = pNVar2, (_func_int **)pcVar5 != pp_Var4)) {
    pNVar3 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
    pNVar3->K = KElaboratedTypeSpefType;
    pNVar3->RHSComponentCache = No;
    pNVar3->ArrayCache = No;
    pNVar3->FunctionCache = No;
    pNVar3->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_00245b80;
    pNVar3[1]._vptr_Node = (_func_int **)pcVar5;
    *(_func_int ***)&pNVar3[1].K = pp_Var4;
    pNVar3[2]._vptr_Node = (_func_int **)pNVar2;
  }
  return pNVar3;
}

Assistant:

Node *Db::parseClassEnumType() {
  StringView ElabSpef;
  if (consumeIf("Ts"))
    ElabSpef = "struct";
  else if (consumeIf("Tu"))
    ElabSpef = "union";
  else if (consumeIf("Te"))
    ElabSpef = "enum";

  Node *Name = parseName();
  if (Name == nullptr)
    return nullptr;

  if (!ElabSpef.empty())
    return make<ElaboratedTypeSpefType>(ElabSpef, Name);

  return Name;
}